

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightfield_tile_list_decoder.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  AvxVideoReader *pAVar3;
  aom_codec_err_t aVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  AvxVideoInfo *pAVar8;
  aom_codec_iface_t *iface;
  char *pcVar9;
  uint8_t *puVar10;
  aom_image_t *paVar11;
  FILE *__stream;
  aom_image_t *paVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  uchar *__ptr;
  char *fmt;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  aom_codec_iter_t iter;
  AvxVideoReader *local_58e0;
  size_t frame_size;
  uint local_58cc;
  uint local_58c8;
  uint tile_size;
  FILE *local_58c0;
  ulong local_58b8;
  ulong local_58b0;
  long local_58a8;
  int local_589c;
  uint local_5898;
  uint local_5894;
  uint local_5890;
  uint local_588c;
  long local_5888;
  ulong local_5880;
  aom_image_t *local_5878;
  aom_codec_ctx_t codec;
  av1_ext_ref_frame_t set_ext_ref;
  aom_image_t reference_images [128];
  
  frame_size = 0;
  exec_name = *argv;
  if (argc < 5) {
    pcVar9 = "Invalid number of arguments.";
LAB_0011de96:
    die(pcVar9);
  }
  local_58e0 = aom_video_reader_open(argv[1]);
  if (local_58e0 == (AvxVideoReader *)0x0) {
    pcVar9 = argv[1];
    fmt = "Failed to open %s for reading.";
  }
  else {
    local_58c0 = fopen64(argv[2],"wb");
    if (local_58c0 != (FILE *)0x0) {
      local_5888 = 0;
      uVar7 = strtol(argv[3],(char **)0x0,0);
      local_58b8 = strtol(argv[4],(char **)0x0,0);
      if (argc != 5) {
        local_5888 = strtol(argv[5],(char **)0x0,0);
        if (2 < (uint)local_5888) {
          pcVar9 = "Output format out of range [0, 2]";
          goto LAB_0011de96;
        }
      }
      pAVar8 = aom_video_reader_get_info(local_58e0);
      iface = get_aom_decoder_by_fourcc(pAVar8->codec_fourcc);
      if (iface == (aom_codec_iface_t *)0x0) {
        pcVar9 = "Unknown input codec.";
      }
      else {
        pcVar9 = aom_codec_iface_name(iface);
        printf("Using %s\n",pcVar9);
        aVar4 = aom_codec_dec_init_ver(&codec,iface,(aom_codec_dec_cfg_t *)0x0,0,0x16);
        if (aVar4 == AOM_CODEC_OK) {
          aVar4 = aom_codec_control(&codec,0x116,(ulong)pAVar8->is_annexb);
          if (aVar4 == AOM_CODEC_OK) {
            aom_codec_control(&codec,0x110,0);
            local_5880 = 0;
            if (0 < (int)uVar7) {
              local_5880 = uVar7 & 0xffffffff;
            }
            local_58a8 = (uVar7 & 0xffffffff) + 1;
            local_58b0 = uVar7;
            for (uVar19 = 0; pAVar3 = local_58e0, uVar19 != local_5880; uVar19 = uVar19 + 1) {
              aom_video_reader_read_frame(local_58e0);
              puVar10 = aom_video_reader_get_frame(pAVar3,&frame_size);
              aVar4 = aom_codec_decode(&codec,puVar10,frame_size,(void *)0x0);
              if (aVar4 != AOM_CODEC_OK) {
                pcVar9 = "Failed to decode frame.";
                goto LAB_0011de2d;
              }
              if (uVar19 == 0) {
                iter = (aom_codec_iter_t)((ulong)iter & 0xffffffff00000000);
                aVar4 = aom_codec_control(&codec,0x106,&iter);
                if (aVar4 != AOM_CODEC_OK) {
                  pcVar9 = "Failed to get the image format";
                  goto LAB_0011de2d;
                }
                aVar4 = aom_codec_control(&codec,0x103,&set_ext_ref);
                if (aVar4 != AOM_CODEC_OK) {
                  pcVar9 = "Failed to get the image frame size";
                  goto LAB_0011de2d;
                }
                lVar15 = local_58a8;
                paVar11 = reference_images;
                while (lVar15 = lVar15 + -1, lVar15 != 0) {
                  paVar12 = aom_img_alloc_with_border
                                      (paVar11,(aom_img_fmt_t)iter,(uint)set_ext_ref.img,
                                       set_ext_ref.img._4_4_,0x20,8,0x40);
                  paVar11 = paVar11 + 1;
                  if (paVar12 == (aom_image_t *)0x0) {
                    fatal("Failed to allocate references.");
                  }
                }
              }
              aVar4 = aom_codec_control(&codec,0xea,reference_images + uVar19);
              if (aVar4 != AOM_CODEC_OK) {
                pcVar9 = "Failed to copy decoded reference frame";
                goto LAB_0011de2d;
              }
              iter = (aom_codec_iter_t)0x0;
              while( true ) {
                paVar11 = aom_codec_get_frame(&codec,&iter);
                if (paVar11 == (aom_image_t *)0x0) break;
                snprintf((char *)&set_ext_ref,0x400,"ref_%d.yuv",uVar19 & 0xffffffff);
                printf("writing ref image to %s, %u, %u\n",&set_ext_ref,(ulong)paVar11->d_w);
                __stream = fopen64((char *)&set_ext_ref,"wb");
                aom_img_write(paVar11,(FILE *)__stream);
                fclose(__stream);
              }
            }
            aom_codec_control(&codec,0x110,1);
            set_ext_ref.img = reference_images;
            set_ext_ref.num = (int)local_58b0;
            aom_codec_control(&codec,0x113);
            pAVar3 = local_58e0;
            aom_video_reader_read_frame(local_58e0);
            puVar10 = aom_video_reader_get_frame(pAVar3,&frame_size);
            aVar4 = aom_codec_decode(&codec,puVar10,frame_size,(void *)0x0);
            if (aVar4 == AOM_CODEC_OK) {
              iVar6 = (int)local_58b8;
              local_58b8 = local_58b8 & 0xffffffff;
              if (iVar6 < 1) {
                local_58b8 = 0;
              }
              for (iVar6 = 0; pAVar3 = local_58e0, iVar6 != (int)local_58b8; iVar6 = iVar6 + 1) {
                aom_video_reader_read_frame(local_58e0);
                puVar10 = aom_video_reader_get_frame(pAVar3,&frame_size);
                aVar4 = aom_codec_decode(&codec,puVar10,frame_size,(void *)0x0);
                if (aVar4 != AOM_CODEC_OK) {
                  pcVar9 = "Failed to decode the tile list.";
                  goto LAB_0011de2d;
                }
                iter = (aom_codec_iter_t)0x0;
                paVar11 = aom_codec_get_frame(&codec,&iter);
                if (paVar11 == (aom_image_t *)0x0) {
                  pcVar9 = "Failed to get frame.";
                  goto LAB_0011de2d;
                }
                if ((int)local_5888 == 1) {
                  aom_img_write(paVar11,(FILE *)local_58c0);
                }
                else {
                  if ((int)local_5888 == 0) {
                    tile_size = 0;
                    local_5878 = paVar11;
                    aVar4 = aom_codec_control(&codec,0x107,&tile_size);
                    paVar11 = local_5878;
                    uVar16 = tile_size;
                    if (aVar4 == AOM_CODEC_OK) {
                      local_58cc = tile_size >> 0x10;
                      local_5898 = local_5878->d_w / local_58cc;
                      local_58c8 = 0;
                      aVar4 = aom_codec_control(&codec,0x108,&local_58c8);
                      if (aVar4 == AOM_CODEC_OK) {
                        uVar16 = uVar16 & 0xffff;
                        local_5890 = paVar11->fmt >> 0xb & 1;
                        uVar5 = 0;
                        uVar18 = local_58cc;
                        local_589c = iVar6;
                        local_588c = uVar16;
                        while (iVar6 = local_589c, uVar5 < local_58c8) {
                          iVar6 = (uVar5 / local_5898) * uVar16;
                          iVar14 = (uVar5 % local_5898) * uVar18;
                          local_58a8 = CONCAT44(local_58a8._4_4_,iVar14);
                          local_58b0 = CONCAT44(local_58b0._4_4_,iVar6);
                          local_5894 = uVar5;
                          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
                            if (lVar15 != 0) {
                              bVar13 = (byte)paVar11->x_chroma_shift;
                              bVar1 = (byte)paVar11->y_chroma_shift;
                              iVar6 = iVar6 >> (bVar1 & 0x1f);
                              iVar14 = iVar14 >> (bVar13 & 0x1f);
                              uVar18 = uVar18 >> (bVar13 & 0x1f);
                              uVar16 = uVar16 >> (bVar1 & 0x1f);
                            }
                            bVar13 = (byte)local_5890;
                            iVar2 = paVar11->stride[lVar15];
                            __ptr = paVar11->planes[lVar15] +
                                    ((iVar14 << (bVar13 & 0x1f)) + iVar2 * iVar6);
                            while (bVar20 = uVar16 != 0, uVar16 = uVar16 - 1, bVar20) {
                              fwrite(__ptr,1,(ulong)(uVar18 << (bVar13 & 0x1f)),local_58c0);
                              __ptr = __ptr + iVar2;
                            }
                            paVar11 = local_5878;
                            uVar16 = local_588c;
                            uVar18 = local_58cc;
                            iVar6 = (int)local_58b0;
                            iVar14 = (int)local_58a8;
                          }
                          uVar5 = local_5894 + 1;
                        }
                        goto LAB_0011dd82;
                      }
                    }
                    pcVar9 = "Failed to get the tile size";
                    goto LAB_0011de2d;
                  }
                  aom_img_write_nv12(paVar11,(FILE *)local_58c0);
                }
LAB_0011dd82:
              }
              lVar15 = local_5880 * 0xa8;
              for (lVar17 = 0; lVar15 - lVar17 != 0; lVar17 = lVar17 + 0xa8) {
                aom_img_free((aom_image_t *)((long)reference_images[0].planes + lVar17 + -0x40));
              }
              aVar4 = aom_codec_destroy(&codec);
              if (aVar4 == AOM_CODEC_OK) {
                aom_video_reader_close(local_58e0);
                fclose(local_58c0);
                return 0;
              }
              pcVar9 = "Failed to destroy codec";
            }
            else {
              pcVar9 = "Failed to decode the frame.";
            }
          }
          else {
            pcVar9 = "Failed to set annex b status";
          }
LAB_0011de2d:
          die_codec(&codec,pcVar9);
        }
        pcVar9 = "Failed to initialize decoder.";
      }
      goto LAB_0011de96;
    }
    pcVar9 = argv[2];
    fmt = "Failed to open %s for writing.";
    local_58c0 = (FILE *)0x0;
  }
  die(fmt,pcVar9);
}

Assistant:

int main(int argc, char **argv) {
  FILE *outfile = NULL;
  AvxVideoReader *reader = NULL;
  const AvxVideoInfo *info = NULL;
  int num_references;
  int num_tile_lists;
  aom_image_t reference_images[MAX_EXTERNAL_REFERENCES];
  size_t frame_size = 0;
  const unsigned char *frame = NULL;
  int output_format = YUV1D;
  int i, j, n;

  exec_name = argv[0];

  if (argc < 5) die("Invalid number of arguments.");

  reader = aom_video_reader_open(argv[1]);
  if (!reader) die("Failed to open %s for reading.", argv[1]);

  if (!(outfile = fopen(argv[2], "wb")))
    die("Failed to open %s for writing.", argv[2]);

  num_references = (int)strtol(argv[3], NULL, 0);
  num_tile_lists = (int)strtol(argv[4], NULL, 0);

  if (argc > 5) output_format = (int)strtol(argv[5], NULL, 0);
  if (output_format < YUV1D || output_format > NV12)
    die("Output format out of range [0, 2]");

  info = aom_video_reader_get_info(reader);

  aom_codec_iface_t *decoder = get_aom_decoder_by_fourcc(info->codec_fourcc);
  if (!decoder) die("Unknown input codec.");
  printf("Using %s\n", aom_codec_iface_name(decoder));

  aom_codec_ctx_t codec;
  if (aom_codec_dec_init(&codec, decoder, NULL, 0))
    die("Failed to initialize decoder.");

  if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_SET_IS_ANNEXB,
                                    info->is_annexb)) {
    die_codec(&codec, "Failed to set annex b status");
  }

  // Decode anchor frames.
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_SET_TILE_MODE, 0);
  for (i = 0; i < num_references; ++i) {
    aom_video_reader_read_frame(reader);
    frame = aom_video_reader_get_frame(reader, &frame_size);
    if (aom_codec_decode(&codec, frame, frame_size, NULL))
      die_codec(&codec, "Failed to decode frame.");

    if (i == 0) {
      aom_img_fmt_t ref_fmt = 0;
      if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_GET_IMG_FORMAT, &ref_fmt))
        die_codec(&codec, "Failed to get the image format");

      int frame_res[2];
      if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_GET_FRAME_SIZE, frame_res))
        die_codec(&codec, "Failed to get the image frame size");

      // Allocate memory to store decoded references. Allocate memory with the
      // border so that it can be used as a reference.
      for (j = 0; j < num_references; j++) {
        unsigned int border = AOM_DEC_BORDER_IN_PIXELS;
        if (!aom_img_alloc_with_border(&reference_images[j], ref_fmt,
                                       frame_res[0], frame_res[1], 32, 8,
                                       border)) {
          fatal("Failed to allocate references.");
        }
      }
    }

    if (AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_COPY_NEW_FRAME_IMAGE,
                                      &reference_images[i]))
      die_codec(&codec, "Failed to copy decoded reference frame");

    aom_codec_iter_t iter = NULL;
    aom_image_t *img = NULL;
    while ((img = aom_codec_get_frame(&codec, &iter)) != NULL) {
      char name[1024];
      snprintf(name, sizeof(name), "ref_%d.yuv", i);
      printf("writing ref image to %s, %u, %u\n", name, img->d_w, img->d_h);
      FILE *ref_file = fopen(name, "wb");
      aom_img_write(img, ref_file);
      fclose(ref_file);
    }
  }

  // Decode the lightfield.
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1_SET_TILE_MODE, 1);

  // Set external references.
  av1_ext_ref_frame_t set_ext_ref = { &reference_images[0], num_references };
  AOM_CODEC_CONTROL_TYPECHECKED(&codec, AV1D_SET_EXT_REF_PTR, &set_ext_ref);
  // Must decode the camera frame header first.
  aom_video_reader_read_frame(reader);
  frame = aom_video_reader_get_frame(reader, &frame_size);
  if (aom_codec_decode(&codec, frame, frame_size, NULL))
    die_codec(&codec, "Failed to decode the frame.");
  // Decode tile lists one by one.
  for (n = 0; n < num_tile_lists; n++) {
    aom_video_reader_read_frame(reader);
    frame = aom_video_reader_get_frame(reader, &frame_size);

    if (aom_codec_decode(&codec, frame, frame_size, NULL))
      die_codec(&codec, "Failed to decode the tile list.");
    aom_codec_iter_t iter = NULL;
    aom_image_t *img = aom_codec_get_frame(&codec, &iter);
    if (!img) die_codec(&codec, "Failed to get frame.");

    if (output_format == YUV1D)
      // write the tile to the output file in 1D format.
      write_tile_yuv1d(&codec, img, outfile);
    else if (output_format == YUV)
      aom_img_write(img, outfile);
    else
      // NV12 output format
      aom_img_write_nv12(img, outfile);
  }

  for (i = 0; i < num_references; i++) aom_img_free(&reference_images[i]);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec");
  aom_video_reader_close(reader);
  fclose(outfile);

  return EXIT_SUCCESS;
}